

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_cache.cpp
# Opt level: O0

void __thiscall libtorrent::block_cache::update_stats_counters(block_cache *this,counters *c)

{
  int iVar1;
  counters *c_local;
  block_cache *this_local;
  
  counters::set_value(c,0xf1,(long)this->m_write_cache_size);
  counters::set_value(c,0xf2,(long)this->m_read_cache_size);
  counters::set_value(c,0xf4,(long)this->m_pinned_blocks);
  iVar1 = linked_list<libtorrent::cached_piece_entry,_void>::size(this->m_lru + 3);
  counters::set_value(c,0x112,(long)iVar1);
  iVar1 = linked_list<libtorrent::cached_piece_entry,_void>::size(this->m_lru + 4);
  counters::set_value(c,0x113,(long)iVar1);
  iVar1 = linked_list<libtorrent::cached_piece_entry,_void>::size(this->m_lru + 5);
  counters::set_value(c,0x114,(long)iVar1);
  iVar1 = linked_list<libtorrent::cached_piece_entry,_void>::size(this->m_lru + 6);
  counters::set_value(c,0x115,(long)iVar1);
  iVar1 = linked_list<libtorrent::cached_piece_entry,_void>::size(this->m_lru + 1);
  counters::set_value(c,0x116,(long)iVar1);
  iVar1 = linked_list<libtorrent::cached_piece_entry,_void>::size(this->m_lru + 2);
  counters::set_value(c,0x117,(long)iVar1);
  return;
}

Assistant:

void block_cache::update_stats_counters(counters& c) const
{
	c.set_value(counters::write_cache_blocks, m_write_cache_size);
	c.set_value(counters::read_cache_blocks, m_read_cache_size);
	c.set_value(counters::pinned_blocks, m_pinned_blocks);

	c.set_value(counters::arc_mru_size, m_lru[cached_piece_entry::read_lru1].size());
	c.set_value(counters::arc_mru_ghost_size, m_lru[cached_piece_entry::read_lru1_ghost].size());
	c.set_value(counters::arc_mfu_size, m_lru[cached_piece_entry::read_lru2].size());
	c.set_value(counters::arc_mfu_ghost_size, m_lru[cached_piece_entry::read_lru2_ghost].size());
	c.set_value(counters::arc_write_size, m_lru[cached_piece_entry::write_lru].size());
	c.set_value(counters::arc_volatile_size, m_lru[cached_piece_entry::volatile_read_lru].size());
}